

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

Read<signed_char>
Omega_h::inertia::anon_unknown_0::mark_bisection_internal
          (CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> axis,Vector<3> center,
          Real total_mass)

{
  Vector<3> axis_00;
  bool bVar1;
  Read<double> *in_RCX;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  Read<double> local_1a8;
  Read<double> local_198;
  shared_ptr<Omega_h::Comm> local_188;
  double local_178;
  double dStack_170;
  double local_168;
  double local_158;
  double dStack_150;
  double local_148;
  Read<double> local_138;
  Reals local_128;
  double dStack_118;
  Vector<3> axis2;
  Int i;
  Read<double> local_e8;
  shared_ptr<Omega_h::Comm> local_d8;
  undefined1 local_c5;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  Read<double> local_80;
  undefined1 local_70 [8];
  Reals dists;
  Real total_mass_local;
  Real tolerance_local;
  Reals *masses_local;
  Reals *coords_local;
  CommPtr *comm_local;
  Read<signed_char> *marked;
  
  dists.write_.shared_alloc_.direct_ptr = (void *)total_mass;
  Read<double>::Read(&local_80,masses);
  local_88 = center.super_Few<double,_3>.array_[2];
  local_98 = center.super_Few<double,_3>.array_[0];
  dStack_90 = center.super_Few<double,_3>.array_[1];
  local_a8 = axis.super_Few<double,_3>.array_[2];
  local_b8 = axis.super_Few<double,_3>.array_[0];
  dStack_b0 = axis.super_Few<double,_3>.array_[1];
  get_distances((Reals *)local_70,center,axis);
  Read<double>::~Read(&local_80);
  local_c5 = 0;
  (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_d8,(shared_ptr<Omega_h::Comm> *)coords);
  Read<double>::Read(&local_e8,(Read<double> *)local_70);
  Read<double>::Read((Read<double> *)&i,in_RCX);
  bVar1 = mark_axis_bisection(&local_d8,&local_e8,(Reals *)&i,
                              (Real)dists.write_.shared_alloc_.direct_ptr,tolerance,
                              (Read<signed_char> *)comm);
  Read<double>::~Read((Read<double> *)&i);
  Read<double>::~Read(&local_e8);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_d8);
  if (!bVar1) {
    for (axis2.super_Few<double,_3>.array_[2]._0_4_ = 0;
        (int)axis2.super_Few<double,_3>.array_[2]._0_4_ < 6;
        axis2.super_Few<double,_3>.array_[2]._0_4_ = axis2.super_Few<double,_3>.array_[2]._0_4_ + 1)
    {
      axis2.super_Few<double,_3>.array_
      [(long)((int)axis2.super_Few<double,_3>.array_[2]._0_4_ / 2) + -1] =
           axis2.super_Few<double,_3>.array_
           [(long)((int)axis2.super_Few<double,_3>.array_[2]._0_4_ / 2) + -1] +
           *(double *)
            (&DAT_00732220 +
            (ulong)(axis2.super_Few<double,_3>.array_[2]._0_4_ !=
                   (axis2.super_Few<double,_3>.array_[2]._0_4_ -
                    ((int)axis2.super_Few<double,_3>.array_[2]._0_4_ >> 0x1f) & 0xfffffffe)) * 8);
      dStack_118 = axis.super_Few<double,_3>.array_[0];
      axis2.super_Few<double,_3>.array_[0] = axis.super_Few<double,_3>.array_[1];
      axis2.super_Few<double,_3>.array_[1] = axis.super_Few<double,_3>.array_[2];
      Read<double>::Read(&local_138,masses);
      local_148 = center.super_Few<double,_3>.array_[2];
      local_158 = center.super_Few<double,_3>.array_[0];
      dStack_150 = center.super_Few<double,_3>.array_[1];
      local_168 = axis2.super_Few<double,_3>.array_[1];
      local_178 = dStack_118;
      dStack_170 = axis2.super_Few<double,_3>.array_[0];
      axis_00.super_Few<double,_3>.array_[1] = axis2.super_Few<double,_3>.array_[0];
      axis_00.super_Few<double,_3>.array_[0] = dStack_118;
      axis_00.super_Few<double,_3>.array_[2] = axis2.super_Few<double,_3>.array_[1];
      get_distances(&local_128,center,axis_00);
      Read<double>::operator=((Read<double> *)local_70,&local_128);
      Read<double>::~Read(&local_128);
      Read<double>::~Read(&local_138);
      std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_188,(shared_ptr<Omega_h::Comm> *)coords);
      Read<double>::Read(&local_198,(Read<double> *)local_70);
      Read<double>::Read(&local_1a8,in_RCX);
      bVar1 = mark_axis_bisection(&local_188,&local_198,&local_1a8,
                                  (Real)dists.write_.shared_alloc_.direct_ptr,tolerance,
                                  (Read<signed_char> *)comm);
      Read<double>::~Read(&local_1a8);
      Read<double>::~Read(&local_198);
      std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_188);
      if (bVar1) goto LAB_0049691d;
    }
    std::operator<<((ostream *)&std::cerr,"Omega_h WARNING: no good inertial bisection\n");
  }
LAB_0049691d:
  local_c5 = 1;
  axis2.super_Few<double,_3>.array_[2]._4_4_ = 1;
  Read<double>::~Read((Read<double> *)local_70);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)comm;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_bisection_internal(CommPtr comm, Reals coords, Reals masses,
    Real tolerance, Vector<3> axis, Vector<3> center, Real total_mass) {
  auto dists = get_distances(coords, center, axis);
  Read<I8> marked;
  if (mark_axis_bisection(comm, dists, masses, total_mass, tolerance, marked)) {
    return marked;
  }
  // if we couldn't find a decent cutting plane, this may be a highly
  // structured mesh with many points coincident on the cutting plane.
  // perturb the axis vector to escape this scenario
  for (Int i = 0; i < 3 * 2; ++i) {
    auto axis2 = axis;
    axis2[i / 2] += (i % 2) ? 1e-3 : -1e-3;
    dists = get_distances(coords, center, axis2);
    if (mark_axis_bisection(
            comm, dists, masses, total_mass, tolerance, marked)) {
      return marked;
    }
  }
  // even perturbation of the axis could not find a good
  // cutting plane. warn the user of this failure, but continue
  // with the axis that we have, because the cutting plane
  // is still the best we could find.
  // (to date I have not seen this happen, even with > 1 billion elements)
  std::cerr << "Omega_h WARNING: no good inertial bisection\n";
  return marked;
}